

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

Sfm_Lib_t * Sfm_LibStart(int nVars,int fDelay,int fVerbose)

{
  int iVar1;
  Sfm_Lib_t *pSVar2;
  word *pEntry;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar3;
  Sfm_Fun_t *pSVar4;
  int Fill;
  int Fill_00;
  int Fill_01;
  ulong uVar5;
  
  pSVar2 = (Sfm_Lib_t *)calloc(1,0xa0);
  if (8 < nVars) {
    __assert_fail("nVars <= SFM_SUPP_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                  ,0xcf,"Sfm_Lib_t *Sfm_LibStart(int, int, int)");
  }
  uVar5 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar5 = 1;
  }
  pEntry = (word *)calloc(1,uVar5 * 8);
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = (int)uVar5;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  iVar1 = Abc_PrimeCudd(10000);
  pVVar3 = Vec_IntAlloc(iVar1);
  pVVar3->nSize = iVar1;
  memset(pVVar3->pArray,0xff,(long)iVar1 << 2);
  p->vTable = pVVar3;
  pVVar3 = Vec_IntAlloc(10000);
  p->vNexts = pVVar3;
  iVar1 = Vec_MemHashInsert(p,pEntry);
  if (iVar1 == 0) {
    memset(pEntry,0xaa,uVar5 * 8);
    iVar1 = Vec_MemHashInsert(p,pEntry);
    if (iVar1 == 1) {
      free(pEntry);
      pSVar2->vTtMem = p;
      Vec_IntGrow(&pSVar2->vLists,0x10000);
      Vec_IntGrow(&pSVar2->vCounts,0x10000);
      Vec_IntGrow(&pSVar2->vHits,0x10000);
      Vec_IntFill(&pSVar2->vLists,2,Fill);
      Vec_IntFill(&pSVar2->vCounts,2,Fill_00);
      Vec_IntFill(&pSVar2->vHits,2,Fill_01);
      pSVar2->nObjsAlloc = 0x10000;
      pSVar4 = (Sfm_Fun_t *)calloc(0x10000,0x1c);
      pSVar2->pObjs = pSVar4;
      pSVar2->fDelay = fDelay;
      if (fDelay != 0) {
        Vec_IntGrow(&pSVar2->vProfs,0x10000);
        Vec_IntGrow(&pSVar2->vStore,0x40000);
      }
      Vec_IntGrow(&pSVar2->vTemp,0x10);
      pSVar2->nVars = nVars;
      pSVar2->nWords = (int)uVar5;
      pSVar2->fVerbose = fVerbose;
      return pSVar2;
    }
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x18e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  __assert_fail("Value == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                ,0x189,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
}

Assistant:

Sfm_Lib_t * Sfm_LibStart( int nVars, int fDelay, int fVerbose )
{
    Sfm_Lib_t * p = ABC_CALLOC( Sfm_Lib_t, 1 );
    assert( nVars <= SFM_SUPP_MAX );
    p->vTtMem = Vec_MemAllocForTT( nVars, 0 );   
    Vec_IntGrow( &p->vLists,  (1 << 16) );
    Vec_IntGrow( &p->vCounts, (1 << 16) );
    Vec_IntGrow( &p->vHits,   (1 << 16) );
    Vec_IntFill( &p->vLists,  2, -1 );
    Vec_IntFill( &p->vCounts, 2, -1 );
    Vec_IntFill( &p->vHits,   2, -1 );
    p->nObjsAlloc = (1 << 16);
    p->pObjs = ABC_CALLOC( Sfm_Fun_t, p->nObjsAlloc );
    p->fDelay = fDelay;
    if ( fDelay ) Vec_IntGrow( &p->vProfs,  (1 << 16) );
    if ( fDelay ) Vec_IntGrow( &p->vStore,  (1 << 18) );
    Vec_IntGrow( &p->vTemp, 16 );
    p->nVars = nVars;
    p->nWords = Abc_TtWordNum( nVars );
    p->fVerbose = fVerbose;
    return p;
}